

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_pointers_t.c
# Opt level: O0

void run_tests(int mode,char *mode_desc)

{
  char *db_file;
  MMDB_s *mmdb_00;
  char *description;
  char *language;
  uint16_t i;
  char *repeated_string;
  MMDB_s *mmdb;
  char *path;
  char *filename;
  char *mode_desc_local;
  int mode_local;
  
  db_file = test_database_path("MaxMind-DB-test-metadata-pointers.mmdb");
  mmdb_00 = open_ok(db_file,mode,mode_desc);
  free(db_file);
  is_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/metadata_pointers_t.c"
            ,0xd,(mmdb_00->metadata).database_type,"Lots of pointers in metadata",
            "decoded pointer database_type",0);
  for (language._6_2_ = 0; (ulong)language._6_2_ < (mmdb_00->metadata).description.count;
      language._6_2_ = language._6_2_ + 1) {
    is_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/metadata_pointers_t.c"
              ,0x14,(mmdb_00->metadata).description.descriptions[language._6_2_]->description,
              "Lots of pointers in metadata","%s description",
              (mmdb_00->metadata).description.descriptions[language._6_2_]->language,0);
  }
  MMDB_close(mmdb_00);
  free(mmdb_00);
  return;
}

Assistant:

void run_tests(int mode, const char *mode_desc) {
    const char *filename = "MaxMind-DB-test-metadata-pointers.mmdb";
    char *path = test_database_path(filename);
    MMDB_s *mmdb = open_ok(path, mode, mode_desc);
    free(path);

    char *repeated_string = "Lots of pointers in metadata";

    is(mmdb->metadata.database_type,
       repeated_string,
       "decoded pointer database_type");

    for (uint16_t i = 0; i < mmdb->metadata.description.count; i++) {
        const char *language =
            mmdb->metadata.description.descriptions[i]->language;
        const char *description =
            mmdb->metadata.description.descriptions[i]->description;
        is(description, repeated_string, "%s description", language);
    }

    MMDB_close(mmdb);
    free(mmdb);
}